

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  int iVar2;
  code *pcVar3;
  uint newSize;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  SimpleDictionaryEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
  *dst;
  size_t requestedBytes;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint bucketCount;
  int *local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  uVar1 = this->count;
  newSize = uVar1 * 2;
  bucketCount = 4;
  if ((8 < newSize) &&
     (uVar10 = uVar1 & 0x7fffffff, bucketCount = uVar10, (uVar1 - 1 & uVar10) != 0)) {
    iVar2 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    bucketCount = 2;
    if (uVar10 != 1) {
      bucketCount = 1 << (-((byte)iVar2 ^ 0x1f) & 0x1f);
    }
  }
  local_40 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    if (newSize == 0) {
      dst = (SimpleDictionaryEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
             *)&DAT_00000008;
    }
    else {
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      requestedBytes = 0xffffffffffffffff;
      if (-1 < (int)newSize) {
        requestedBytes = (long)(int)newSize << 4;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00829be5;
        *puVar7 = 0;
      }
      dst = (SimpleDictionaryEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
             *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset((char *)((long)&(dst->
                             super_DefaultHashedEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             ).
                             super_KeyValueEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                             .
                             super_ValueEntry<JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>_>
                             .
                             super_KeyValueEntryDataLayout2<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                             .value + requestedBytes),0,
             (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
      if (dst == (SimpleDictionaryEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                  *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_00829be5:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
    }
    newBuckets = (int *)dst;
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*>,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = (Type)newBuckets;
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*>,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator>
              ((SimpleDictionaryEntry<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*>
                *)newBuckets,(long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = 0x4b;
    if (0 < this->count) {
      lVar8 = 0;
      lVar9 = 0;
      do {
        if (-2 < *(int *)((long)newBuckets + lVar8 + 8)) {
          uVar6 = GetBucket(*(int *)((long)newBuckets + lVar8 + 0xc) * 2 + 1,bucketCount,
                            this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar8 + 8) = local_40[(int)uVar6];
          local_40[(int)uVar6] = (int)lVar9;
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar9 < this->count);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_40;
    this->entries = (Type)newBuckets;
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }